

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

UCollationResult __thiscall
icu_63::RuleBasedCollator::doCompare
          (RuleBasedCollator *this,uint8_t *left,int32_t leftLength,uint8_t *right,
          int32_t rightLength,UErrorCode *errorCode)

{
  byte *pbVar1;
  byte bVar2;
  CollationData *pCVar3;
  Normalizer2Impl *nfcImpl;
  uint8_t uVar4;
  UBool UVar5;
  uint uVar6;
  UCollationResult UVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  CollationSettings *settings;
  uint uVar14;
  int rightLength_00;
  int32_t leftLength_00;
  UTF8CollationIterator rightIter;
  UTF8CollationIterator leftIter;
  byte local_479;
  uint local_474;
  CollationSettings **local_470;
  UErrorCode *local_468;
  ulong local_460;
  RuleBasedCollator *local_458;
  undefined1 local_450 [40];
  UTrie2 *local_428;
  CollationData *local_420;
  undefined4 local_418;
  long *local_410;
  undefined4 local_408;
  undefined1 local_404;
  long local_400 [36];
  int32_t local_2e0;
  SkippedState *local_2d8;
  int32_t local_2d0;
  byte local_2cc;
  uint8_t *local_2c8;
  uint local_2c0;
  int32_t local_2bc;
  long local_2b8;
  int32_t local_2b0;
  undefined1 local_2ac;
  Normalizer2Impl *local_2a8;
  Replaceable local_2a0;
  undefined1 local_298 [88];
  undefined1 local_240 [40];
  UTrie2 *local_218;
  CollationData *local_210;
  undefined4 local_208;
  long *local_200;
  undefined4 local_1f8;
  undefined1 local_1f4;
  long local_1f0 [36];
  int32_t local_d0;
  SkippedState *local_c8;
  int32_t local_c0;
  byte local_bc;
  uint8_t *local_b8;
  uint local_b0;
  int32_t local_ac;
  long local_a8;
  int32_t local_a0;
  undefined1 local_9c;
  Normalizer2Impl *local_98;
  Replaceable local_90;
  undefined1 local_88 [88];
  
  if (left == right && leftLength == rightLength) {
    return UCOL_EQUAL;
  }
  local_474 = 0;
  local_468 = errorCode;
  if (leftLength < 0) {
    uVar4 = *left;
    if (uVar4 == *right) {
      uVar8 = 0;
      do {
        if (uVar4 == '\0') {
          return UCOL_EQUAL;
        }
        uVar12 = uVar8 + 1;
        local_474 = (uint)uVar12;
        uVar4 = left[uVar8 + 1];
        lVar9 = uVar8 + 1;
        uVar8 = uVar12;
      } while (uVar4 == right[lVar9]);
LAB_00220206:
      uVar6 = (uint)uVar12;
      goto LAB_0022023d;
    }
    local_470 = &this->settings;
    local_479 = (byte)this->settings->options >> 1 & 1;
  }
  else {
    if (leftLength == 0) {
LAB_0022020a:
      uVar12 = (ulong)(uint)leftLength;
      uVar6 = leftLength;
      if (leftLength == rightLength) {
        return UCOL_EQUAL;
      }
    }
    else {
      uVar6 = rightLength;
      if (rightLength == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0;
        do {
          if (left[uVar12] != right[uVar12]) goto LAB_00220206;
          uVar8 = uVar12 + 1;
          local_474 = (uint)uVar8;
          if (leftLength + -1 == (int)uVar12) goto LAB_0022020a;
          uVar12 = uVar8;
        } while ((long)rightLength != uVar8);
        uVar12 = uVar8 & 0xffffffff;
      }
    }
LAB_0022023d:
    uVar14 = (uint)uVar12;
    if ((0 < (int)uVar6) &&
       (((uVar6 != leftLength && ((char)left[uVar6] < -0x40)) ||
        ((uVar6 != rightLength && ((char)right[uVar6] < -0x40)))))) {
      uVar8 = uVar12 & 0xffffffff;
      uVar6 = 1;
      if ((int)uVar14 < 1) {
        uVar6 = uVar14;
      }
      do {
        uVar8 = uVar8 - 1;
        uVar14 = uVar6 - 1;
        local_474 = uVar6 - 1;
        if ((int)uVar12 < 2) break;
        uVar14 = (int)uVar12 - 1;
        uVar12 = (ulong)uVar14;
        local_474 = uVar14;
      } while ((char)left[uVar8 & 0xffffffff] < -0x40);
    }
    local_470 = &this->settings;
    local_479 = (byte)this->settings->options >> 1 & 1;
    if (0 < (int)uVar14) {
      if (uVar14 == leftLength) {
LAB_002202e2:
        if (uVar14 != rightLength) {
          uVar8 = (ulong)uVar14;
          bVar2 = right[uVar8];
          uVar6 = (uint)bVar2;
          if ((char)bVar2 < '\0') {
            uVar12 = uVar8 + 1;
            uVar6 = 0xfffd;
            if ((int)uVar12 != rightLength) {
              if (bVar2 < 0xe0) {
                if (0xc1 < bVar2) {
                  uVar14 = bVar2 & 0x1f;
LAB_0022099f:
                  if ((byte)(right[uVar12 & 0xffffffff] ^ 0x80) < 0x40) {
                    uVar6 = uVar14 << 6 | right[uVar12 & 0xffffffff] ^ 0x80;
                  }
                }
              }
              else if (bVar2 < 0xf0) {
                uVar14 = bVar2 & 0xf;
                if (((byte)" 000000000000\x1000"[uVar14] >> (right[uVar12] >> 5) & 1) != 0) {
                  bVar13 = right[uVar12] & 0x3f;
LAB_00220950:
                  uVar11 = (int)uVar12 + 1;
                  uVar12 = (ulong)uVar11;
                  if (uVar11 != rightLength) {
                    uVar14 = (uint)bVar13 | uVar14 << 6;
                    goto LAB_0022099f;
                  }
                }
              }
              else if (bVar2 < 0xf5) {
                pbVar1 = right + uVar12;
                if (((((uint)(int)""[*pbVar1 >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
                    (uVar12 = uVar8 + 2, (int)uVar12 != rightLength)) &&
                   (bVar13 = right[uVar12] + 0x80, bVar13 < 0x40)) {
                  uVar14 = *pbVar1 & 0x3f | (bVar2 - 0xf0) * 0x40;
                  goto LAB_00220950;
                }
              }
            }
          }
          UVar5 = CollationData::isUnsafeBackward(this->data,uVar6,local_479);
          if (UVar5 != '\0') goto LAB_0022031d;
        }
      }
      else {
        uVar8 = (ulong)uVar14;
        bVar2 = left[uVar8];
        uVar6 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          uVar12 = uVar8 + 1;
          uVar6 = 0xfffd;
          if ((int)uVar12 != leftLength) {
            if (bVar2 < 0xe0) {
              if (0xc1 < bVar2) {
                uVar11 = bVar2 & 0x1f;
LAB_00220972:
                if ((byte)(left[uVar12 & 0xffffffff] ^ 0x80) < 0x40) {
                  uVar6 = uVar11 << 6 | left[uVar12 & 0xffffffff] ^ 0x80;
                }
              }
            }
            else if (bVar2 < 0xf0) {
              uVar11 = bVar2 & 0xf;
              if (((byte)" 000000000000\x1000"[uVar11] >> (left[uVar12] >> 5) & 1) != 0) {
                bVar13 = left[uVar12] & 0x3f;
LAB_00220908:
                uVar10 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar10;
                if (uVar10 != leftLength) {
                  uVar11 = (uint)bVar13 | uVar11 << 6;
                  goto LAB_00220972;
                }
              }
            }
            else if (bVar2 < 0xf5) {
              pbVar1 = left + uVar12;
              if (((((uint)(int)""[*pbVar1 >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
                  (uVar12 = uVar8 + 2, (int)uVar12 != leftLength)) &&
                 (bVar13 = left[uVar12] + 0x80, bVar13 < 0x40)) {
                uVar11 = *pbVar1 & 0x3f | (bVar2 - 0xf0) * 0x40;
                goto LAB_00220908;
              }
            }
          }
        }
        UVar5 = CollationData::isUnsafeBackward(this->data,uVar6,local_479);
        if (UVar5 == '\0') goto LAB_002202e2;
LAB_0022031d:
        do {
          lVar9 = (long)(int)local_474;
          local_474 = local_474 - 1;
          bVar2 = left[lVar9 + -1];
          uVar6 = (uint)bVar2;
          if ((char)bVar2 < '\0') {
            uVar6 = utf8_prevCharSafeBody_63(left,0,(int32_t *)&local_474,(uint)bVar2,-3);
          }
          if ((int)local_474 < 1) break;
          UVar5 = CollationData::isUnsafeBackward(this->data,uVar6,local_479);
        } while (UVar5 != '\0');
      }
    }
  }
  settings = *local_470;
  if (((-1 < settings->fastLatinOptions) &&
      ((lVar9 = (long)(int)local_474, leftLength == local_474 || (left[lVar9] < 0xc6)))) &&
     ((rightLength == local_474 || (right[lVar9] < 0xc6)))) {
    if (leftLength < 0) {
      rightLength_00 = -1;
      leftLength_00 = -1;
    }
    else {
      leftLength_00 = leftLength - local_474;
      rightLength_00 = rightLength - local_474;
    }
    UVar7 = CollationFastLatin::compareUTF8
                      (this->data->fastLatinTable,settings->fastLatinPrimaries,
                       settings->fastLatinOptions,left + lVar9,leftLength_00,right + lVar9,
                       rightLength_00);
    if (UVar7 != ~UCOL_GREATER) goto LAB_0022067b;
    settings = *local_470;
  }
  local_2c8 = right;
  local_2bc = rightLength;
  local_b8 = left;
  local_ac = leftLength;
  if ((settings->options & 1) == 0) {
    local_450._16_8_ = this->data;
    local_450._8_8_ = *(undefined8 *)local_450._16_8_;
    local_240._32_8_ = &local_210;
    local_240._24_8_ = (ulong)(uint)local_240._28_4_ << 0x20;
    local_218 = (UTrie2 *)CONCAT35(local_218._5_3_,0x28);
    local_d0 = 0;
    local_c8 = (SkippedState *)0x0;
    local_c0 = -1;
    local_bc = local_479;
    local_240._0_8_ = &PTR__UTF8CollationIterator_003d4b10;
    local_b0 = local_474;
    local_450._32_8_ = &local_420;
    local_450._24_8_ = (ulong)(uint)local_450._28_4_ << 0x20;
    local_428 = (UTrie2 *)CONCAT35(local_428._5_3_,0x28);
    local_2e0 = 0;
    local_2d8 = (SkippedState *)0x0;
    local_2d0 = -1;
    local_2cc = local_479;
    local_450._0_8_ = &PTR__UTF8CollationIterator_003d4b10;
    local_2c0 = local_474;
    local_240._8_8_ = local_450._8_8_;
    local_240._16_8_ = local_450._16_8_;
    UVar7 = CollationCompare::compareUpToQuaternary
                      ((CollationIterator *)local_240,(CollationIterator *)local_450,settings,
                       local_468);
    UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)local_450);
    UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)local_240);
  }
  else {
    local_450._16_8_ = this->data;
    local_450._8_8_ = *(undefined8 *)local_450._16_8_;
    local_240._32_8_ = &local_210;
    local_240._24_8_ = (ulong)(uint)local_240._28_4_ << 0x20;
    local_218 = (UTrie2 *)CONCAT35(local_218._5_3_,0x28);
    local_d0 = 0;
    local_c8 = (SkippedState *)0x0;
    local_c0 = -1;
    local_bc = local_479;
    local_b0 = local_474;
    local_240._0_8_ = &PTR__FCDUTF8CollationIterator_003d4a80;
    local_a8 = (ulong)local_474 << 0x20;
    local_2a8 = *(Normalizer2Impl **)(local_450._16_8_ + 0x30);
    local_90.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
    local_88._0_2_ = 2;
    local_450._32_8_ = &local_420;
    local_450._24_8_ = (ulong)(uint)local_450._28_4_ << 0x20;
    local_428 = (UTrie2 *)CONCAT35(local_428._5_3_,0x28);
    local_2e0 = 0;
    local_2d8 = (SkippedState *)0x0;
    local_2d0 = -1;
    local_2cc = local_479;
    local_2c0 = local_474;
    local_450._0_8_ = &PTR__FCDUTF8CollationIterator_003d4a80;
    local_2b8 = (ulong)local_474 << 0x20;
    local_2a0.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
    local_298._0_2_ = 2;
    local_460 = (ulong)(uint)leftLength;
    local_458 = this;
    local_240._8_8_ = local_450._8_8_;
    local_240._16_8_ = local_450._16_8_;
    local_98 = local_2a8;
    UVar7 = CollationCompare::compareUpToQuaternary
                      ((CollationIterator *)local_240,(CollationIterator *)local_450,settings,
                       local_468);
    FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)local_450);
    FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)local_240);
    leftLength = (int32_t)local_460;
    this = local_458;
  }
LAB_0022067b:
  if (UVar7 == UCOL_EQUAL) {
    UVar7 = UCOL_EQUAL;
    if ((0xefff < (*local_470)->options) &&
       (UVar7 = UCOL_EQUAL, *local_468 < U_ILLEGAL_ARGUMENT_ERROR)) {
      pCVar3 = this->data;
      uVar6 = 0;
      if (0 < leftLength) {
        uVar6 = local_474;
      }
      nfcImpl = pCVar3->nfcImpl;
      if (((*local_470)->options & 1U) == 0) {
        local_240._24_8_ = 0xffffffff;
        local_240._0_8_ = &PTR__UObject_003d44d8;
        local_218 = (UTrie2 *)((ulong)(leftLength - uVar6) << 0x20);
        local_450._24_8_ = 0xffffffff;
        local_450._0_8_ = &PTR__UObject_003d44d8;
        local_428 = (UTrie2 *)((ulong)(rightLength - uVar6) << 0x20);
        local_450._32_8_ = (Normalizer2Impl *)(right + (int)local_474);
        local_240._32_8_ = (Normalizer2Impl *)(left + (int)local_474);
        UVar7 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)local_240,(NFDIterator *)local_450);
        UObject::~UObject((UObject *)local_450);
      }
      else {
        local_240._24_8_ = 0xffffffff;
        local_240._0_8_ = &PTR__FCDUTF8NFDIterator_003d4520;
        local_428 = pCVar3->trie;
        local_208 = 0;
        local_200 = local_1f0;
        local_1f8 = 0x28;
        local_1f4 = 0;
        local_b0 = 0;
        local_a8 = 0;
        local_a0 = -1;
        local_9c = 0;
        local_90.super_UObject._vptr_UObject = (UObject)((ulong)(leftLength - uVar6) << 0x20);
        local_240._32_8_ = &PTR__FCDUTF8CollationIterator_003d4a80;
        local_88._0_8_ = 0;
        local_88._24_8_ = &PTR__UnicodeString_003e4fd8;
        local_88._32_2_ = L'\x02';
        local_450._24_8_ = 0xffffffff;
        local_450._0_8_ = &PTR__FCDUTF8NFDIterator_003d4520;
        local_418 = 0;
        local_410 = local_400;
        local_408 = 0x28;
        local_404 = 0;
        local_2c0 = 0;
        local_2b8 = 0;
        local_2b0 = -1;
        local_2ac = 0;
        local_2a0.super_UObject._vptr_UObject = (UObject)((ulong)(rightLength - uVar6) << 0x20);
        local_450._32_8_ = &PTR__FCDUTF8CollationIterator_003d4a80;
        local_298._0_8_ = 0;
        local_298._24_8_ = &PTR__UnicodeString_003e4fd8;
        local_298._32_2_ = L'\x02';
        local_420 = pCVar3;
        local_2a8 = (Normalizer2Impl *)(right + (int)local_474);
        local_298._16_8_ = nfcImpl;
        local_218 = local_428;
        local_210 = pCVar3;
        local_98 = (Normalizer2Impl *)(left + (int)local_474);
        local_88._16_8_ = nfcImpl;
        UVar7 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)local_240,(NFDIterator *)local_450);
        local_450._0_8_ = &PTR__FCDUTF8NFDIterator_003d4520;
        FCDUTF8CollationIterator::~FCDUTF8CollationIterator
                  ((FCDUTF8CollationIterator *)(local_450 + 0x20));
        UObject::~UObject((UObject *)local_450);
        local_240._0_8_ = &PTR__FCDUTF8NFDIterator_003d4520;
        FCDUTF8CollationIterator::~FCDUTF8CollationIterator
                  ((FCDUTF8CollationIterator *)(local_240 + 0x20));
      }
      UObject::~UObject((UObject *)local_240);
    }
  }
  return UVar7;
}

Assistant:

UCollationResult
RuleBasedCollator::doCompare(const uint8_t *left, int32_t leftLength,
                             const uint8_t *right, int32_t rightLength,
                             UErrorCode &errorCode) const {
    // U_FAILURE(errorCode) checked by caller.
    if(left == right && leftLength == rightLength) {
        return UCOL_EQUAL;
    }

    // Identical-prefix test.
    int32_t equalPrefixLength = 0;
    if(leftLength < 0) {
        uint8_t c;
        while((c = left[equalPrefixLength]) == right[equalPrefixLength]) {
            if(c == 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }
    } else {
        for(;;) {
            if(equalPrefixLength == leftLength) {
                if(equalPrefixLength == rightLength) { return UCOL_EQUAL; }
                break;
            } else if(equalPrefixLength == rightLength ||
                      left[equalPrefixLength] != right[equalPrefixLength]) {
                break;
            }
            ++equalPrefixLength;
        }
    }
    // Back up to the start of a partially-equal code point.
    if(equalPrefixLength > 0 &&
            ((equalPrefixLength != leftLength && U8_IS_TRAIL(left[equalPrefixLength])) ||
            (equalPrefixLength != rightLength && U8_IS_TRAIL(right[equalPrefixLength])))) {
        while(--equalPrefixLength > 0 && U8_IS_TRAIL(left[equalPrefixLength])) {}
    }

    UBool numeric = settings->isNumeric();
    if(equalPrefixLength > 0) {
        UBool unsafe = FALSE;
        if(equalPrefixLength != leftLength) {
            int32_t i = equalPrefixLength;
            UChar32 c;
            U8_NEXT_OR_FFFD(left, i, leftLength, c);
            unsafe = data->isUnsafeBackward(c, numeric);
        }
        if(!unsafe && equalPrefixLength != rightLength) {
            int32_t i = equalPrefixLength;
            UChar32 c;
            U8_NEXT_OR_FFFD(right, i, rightLength, c);
            unsafe = data->isUnsafeBackward(c, numeric);
        }
        if(unsafe) {
            // Identical prefix: Back up to the start of a contraction or reordering sequence.
            UChar32 c;
            do {
                U8_PREV_OR_FFFD(left, 0, equalPrefixLength, c);
            } while(equalPrefixLength > 0 && data->isUnsafeBackward(c, numeric));
        }
        // See the notes in the UTF-16 version.

        // Pass the actual start of each string into the CollationIterators,
        // plus the equalPrefixLength position,
        // so that prefix matches back into the equal prefix work.
    }

    int32_t result;
    int32_t fastLatinOptions = settings->fastLatinOptions;
    if(fastLatinOptions >= 0 &&
            (equalPrefixLength == leftLength ||
                left[equalPrefixLength] <= CollationFastLatin::LATIN_MAX_UTF8_LEAD) &&
            (equalPrefixLength == rightLength ||
                right[equalPrefixLength] <= CollationFastLatin::LATIN_MAX_UTF8_LEAD)) {
        if(leftLength >= 0) {
            result = CollationFastLatin::compareUTF8(data->fastLatinTable,
                                                     settings->fastLatinPrimaries,
                                                     fastLatinOptions,
                                                     left + equalPrefixLength,
                                                     leftLength - equalPrefixLength,
                                                     right + equalPrefixLength,
                                                     rightLength - equalPrefixLength);
        } else {
            result = CollationFastLatin::compareUTF8(data->fastLatinTable,
                                                     settings->fastLatinPrimaries,
                                                     fastLatinOptions,
                                                     left + equalPrefixLength, -1,
                                                     right + equalPrefixLength, -1);
        }
    } else {
        result = CollationFastLatin::BAIL_OUT_RESULT;
    }

    if(result == CollationFastLatin::BAIL_OUT_RESULT) {
        if(settings->dontCheckFCD()) {
            UTF8CollationIterator leftIter(data, numeric, left, equalPrefixLength, leftLength);
            UTF8CollationIterator rightIter(data, numeric, right, equalPrefixLength, rightLength);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        } else {
            FCDUTF8CollationIterator leftIter(data, numeric, left, equalPrefixLength, leftLength);
            FCDUTF8CollationIterator rightIter(data, numeric, right, equalPrefixLength, rightLength);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        }
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return (UCollationResult)result;
    }

    // Note: If NUL-terminated, we could get the actual limits from the iterators now.
    // That would complicate the iterators a bit, NUL-terminated strings are only a C convenience,
    // and the benefit seems unlikely to be measurable.

    // Compare identical level.
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    left += equalPrefixLength;
    right += equalPrefixLength;
    if(leftLength > 0) {
        leftLength -= equalPrefixLength;
        rightLength -= equalPrefixLength;
    }
    if(settings->dontCheckFCD()) {
        UTF8NFDIterator leftIter(left, leftLength);
        UTF8NFDIterator rightIter(right, rightLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUTF8NFDIterator leftIter(data, left, leftLength);
        FCDUTF8NFDIterator rightIter(data, right, rightLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}